

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

bool __thiscall
spvtools::Optimizer::RegisterPassFromFlag(Optimizer *this,string *flag,bool preserve_interface)

{
  bool bVar1;
  type id_value_map;
  type descriptor_set_binding_pairs_00;
  char *packingRule;
  char *pcVar2;
  long lVar3;
  long lVar4;
  MessageConsumer *pMVar5;
  __integer_from_chars_result_type<unsigned_int> _Var6;
  int local_644;
  int local_634;
  int local_624;
  int local_614;
  char *local_5e8;
  spv_position_t local_5e0;
  PassToken local_5c8;
  char *local_5c0;
  spv_position_t local_5b8;
  PassToken local_5a0;
  PassToken local_598;
  spv_position_t local_590;
  PassToken local_578;
  char *local_570;
  spv_position_t local_568;
  char *local_550;
  errc local_548;
  undefined4 uStack_544;
  char *local_540;
  spv_position_t local_538;
  char *local_520;
  spv_position_t local_518;
  char *local_500;
  __integer_from_chars_result_type<unsigned_int> result;
  char *end;
  char *start;
  uint32_t to_set;
  uint32_t from_set;
  PassToken local_4c0;
  string local_4b8 [8];
  string rule_name;
  string struct_name;
  spv_position_t local_470;
  long local_458;
  size_type separator_pos;
  char *local_438;
  spv_position_t local_430;
  PassToken local_418;
  char *local_410;
  spv_position_t local_408;
  undefined1 local_3f0 [8];
  unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  descriptor_set_binding_pairs;
  PassToken local_3e0;
  PassToken local_3d8;
  PassToken local_3d0;
  PassToken local_3c8;
  PassToken local_3c0;
  PassToken local_3b8;
  PassToken local_3b0;
  PassToken local_3a8;
  PassToken local_3a0;
  PassToken local_398;
  spv_position_t local_390;
  int local_374;
  int factor_1;
  spv_position_t local_368;
  PassToken local_350;
  int local_344;
  int factor;
  PassToken local_338;
  PassToken local_330;
  spv_position_t local_328;
  PassToken local_310;
  int local_304;
  undefined1 local_300 [4];
  int max_registers_per_loop;
  PassToken local_2e8;
  int local_2dc;
  int register_threshold_to_split;
  PassToken local_2d0;
  PassToken local_2c8;
  PassToken local_2c0;
  PassToken local_2b8;
  PassToken local_2b0;
  PassToken local_2a8;
  PassToken local_2a0;
  PassToken local_298;
  PassToken local_290;
  spv_position_t local_288;
  PassToken local_270;
  double local_268;
  double load_replacement_threshold;
  PassToken local_258;
  PassToken local_250;
  PassToken local_248;
  PassToken local_240;
  PassToken local_238;
  PassToken local_230;
  PassToken local_228;
  spv_position_t local_220;
  PassToken local_208;
  uint32_t local_1fc;
  int limit;
  PassToken local_1f0;
  PassToken local_1e8;
  PassToken local_1e0;
  PassToken local_1d8;
  PassToken local_1d0;
  PassToken local_1c8;
  PassToken local_1c0;
  PassToken local_1b8;
  PassToken local_1b0;
  PassToken local_1a8;
  PassToken local_1a0;
  PassToken local_198;
  PassToken local_190;
  PassToken local_188;
  PassToken local_180;
  PassToken local_178;
  PassToken local_170;
  PassToken local_168;
  PassToken local_160;
  PassToken local_158;
  PassToken local_150;
  PassToken local_148;
  PassToken local_140;
  PassToken local_138;
  PassToken local_130;
  PassToken local_128;
  char *local_120;
  spv_position_t local_118;
  PassToken local_100;
  uint local_f4;
  char *local_f0;
  spv_position_t local_e8;
  undefined1 local_d0 [8];
  unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  spec_ids_vals;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  undefined1 local_a8 [8];
  string pass_args;
  string pass_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  bool preserve_interface_local;
  string *flag_local;
  Optimizer *this_local;
  
  p.second.field_2._M_local_buf[0xf] = preserve_interface;
  bVar1 = FlagHasValidForm(this,flag);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_007d1a56;
  }
  utils::SplitFlagArgs
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&pass_name.field_2 + 8),flag);
  std::__cxx11::string::string
            ((string *)(pass_args.field_2._M_local_buf + 8),
             (string *)(pass_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a8,(string *)(p.first.field_2._M_local_buf + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&pass_args.field_2 + 8),"strip-debug");
  if (bVar1) {
    CreateStripDebugInfoPass();
    RegisterPass(this,&local_b0);
    PassToken::~PassToken(&local_b0);
LAB_007d1a2a:
    this_local._7_1_ = 1;
    local_f4 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"strip-reflect");
    if (bVar1) {
      CreateStripReflectInfoPass();
      RegisterPass(this,&local_b8);
      PassToken::~PassToken(&local_b8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"strip-nonsemantic");
    if (bVar1) {
      CreateStripNonSemanticInfoPass();
      RegisterPass(this,&local_c0);
      PassToken::~PassToken(&local_c0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"fix-opextinst-opcodes");
    if (bVar1) {
      CreateOpExtInstWithForwardReferenceFixupPass();
      RegisterPass(this,(PassToken *)&spec_ids_vals);
      PassToken::~PassToken((PassToken *)&spec_ids_vals);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"set-spec-const-default-value");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        pMVar5 = consumer(this);
        memset(&local_118,0,0x18);
        local_120 = (char *)std::__cxx11::string::c_str();
        Errorf<char_const*>(pMVar5,(char *)0x0,&local_118,
                            "Invalid spec constant value string \'%s\'. Expected a string of <spec id>:<default value> pairs."
                            ,&local_120);
        this_local._7_1_ = 0;
        local_f4 = 1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString_abi_cxx11_
                  ((SetSpecConstantDefaultValuePass *)local_d0,pcVar2);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_d0);
        if (bVar1) {
          id_value_map = std::
                         unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator*((unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)local_d0);
          CreateSetSpecConstantDefaultValuePass((spvtools *)&local_100,id_value_map);
          RegisterPass(this,&local_100);
          PassToken::~PassToken(&local_100);
        }
        else {
          pMVar5 = consumer(this);
          memset(&local_e8,0,0x18);
          local_f0 = (char *)std::__cxx11::string::c_str();
          Errorf<char_const*>(pMVar5,(char *)0x0,&local_e8,
                              "Invalid argument for --set-spec-const-default-value: %s",&local_f0);
          this_local._7_1_ = 0;
        }
        local_f4 = (uint)!bVar1;
        std::
        unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~unique_ptr((unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)local_d0);
joined_r0x007d119d:
        if (local_f4 == 0) goto LAB_007d1a2a;
      }
      goto LAB_007d1a38;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"if-conversion");
    if (bVar1) {
      CreateIfConversionPass();
      RegisterPass(this,&local_128);
      PassToken::~PassToken(&local_128);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"freeze-spec-const");
    if (bVar1) {
      CreateFreezeSpecConstantValuePass();
      RegisterPass(this,&local_130);
      PassToken::~PassToken(&local_130);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"inline-entry-points-exhaustive");
    if (bVar1) {
      CreateInlineExhaustivePass();
      RegisterPass(this,&local_138);
      PassToken::~PassToken(&local_138);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"inline-entry-points-opaque");
    if (bVar1) {
      CreateInlineOpaquePass();
      RegisterPass(this,&local_140);
      PassToken::~PassToken(&local_140);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"combine-access-chains");
    if (bVar1) {
      CreateCombineAccessChainsPass();
      RegisterPass(this,&local_148);
      PassToken::~PassToken(&local_148);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"convert-local-access-chains");
    if (bVar1) {
      CreateLocalAccessChainConvertPass();
      RegisterPass(this,&local_150);
      PassToken::~PassToken(&local_150);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),
                            "replace-desc-array-access-using-var-index");
    if (bVar1) {
      CreateReplaceDescArrayAccessUsingVarIndexPass();
      RegisterPass(this,&local_158);
      PassToken::~PassToken(&local_158);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"spread-volatile-semantics");
    if (bVar1) {
      CreateSpreadVolatileSemanticsPass();
      RegisterPass(this,&local_160);
      PassToken::~PassToken(&local_160);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"descriptor-scalar-replacement");
    if (bVar1) {
      CreateDescriptorScalarReplacementPass();
      RegisterPass(this,&local_168);
      PassToken::~PassToken(&local_168);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"descriptor-composite-scalar-replacement"
                           );
    if (bVar1) {
      CreateDescriptorCompositeScalarReplacementPass();
      RegisterPass(this,&local_170);
      PassToken::~PassToken(&local_170);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"descriptor-array-scalar-replacement");
    if (bVar1) {
      CreateDescriptorArrayScalarReplacementPass();
      RegisterPass(this,&local_178);
      PassToken::~PassToken(&local_178);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-code-aggressive");
    if (bVar1) {
      CreateAggressiveDCEPass((spvtools *)&local_180,(bool)(p.second.field_2._M_local_buf[0xf] & 1))
      ;
      RegisterPass(this,&local_180);
      PassToken::~PassToken(&local_180);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-insert-extract");
    if (bVar1) {
      CreateInsertExtractElimPass();
      RegisterPass(this,&local_188);
      PassToken::~PassToken(&local_188);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-local-single-block");
    if (bVar1) {
      CreateLocalSingleBlockLoadStoreElimPass();
      RegisterPass(this,&local_190);
      PassToken::~PassToken(&local_190);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-local-single-store");
    if (bVar1) {
      CreateLocalSingleStoreElimPass();
      RegisterPass(this,&local_198);
      PassToken::~PassToken(&local_198);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"merge-blocks");
    if (bVar1) {
      CreateBlockMergePass();
      RegisterPass(this,&local_1a0);
      PassToken::~PassToken(&local_1a0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"merge-return");
    if (bVar1) {
      CreateMergeReturnPass();
      RegisterPass(this,&local_1a8);
      PassToken::~PassToken(&local_1a8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-branches");
    if (bVar1) {
      CreateDeadBranchElimPass();
      RegisterPass(this,&local_1b0);
      PassToken::~PassToken(&local_1b0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-functions");
    if (bVar1) {
      CreateEliminateDeadFunctionsPass();
      RegisterPass(this,&local_1b8);
      PassToken::~PassToken(&local_1b8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-local-multi-store");
    if (bVar1) {
      CreateLocalMultiStoreElimPass();
      RegisterPass(this,&local_1c0);
      PassToken::~PassToken(&local_1c0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-const");
    if (bVar1) {
      CreateEliminateDeadConstantPass();
      RegisterPass(this,&local_1c8);
      PassToken::~PassToken(&local_1c8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-inserts");
    if (bVar1) {
      CreateDeadInsertElimPass();
      RegisterPass(this,&local_1d0);
      PassToken::~PassToken(&local_1d0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-variables");
    if (bVar1) {
      CreateDeadVariableEliminationPass();
      RegisterPass(this,&local_1d8);
      PassToken::~PassToken(&local_1d8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-members");
    if (bVar1) {
      CreateEliminateDeadMembersPass();
      RegisterPass(this,&local_1e0);
      PassToken::~PassToken(&local_1e0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"fold-spec-const-op-composite");
    if (bVar1) {
      CreateFoldSpecConstantOpAndCompositePass();
      RegisterPass(this,&local_1e8);
      PassToken::~PassToken(&local_1e8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-unswitch");
    if (bVar1) {
      CreateLoopUnswitchPass();
      RegisterPass(this,&local_1f0);
      PassToken::~PassToken(&local_1f0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"scalar-replacement");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        CreateScalarReplacementPass((spvtools *)&stack0xfffffffffffffe08,100);
        RegisterPass(this,(PassToken *)&stack0xfffffffffffffe08);
        PassToken::~PassToken((PassToken *)&stack0xfffffffffffffe08);
      }
      else {
        local_1fc = 0xffffffff;
        lVar4 = std::__cxx11::string::find_first_not_of(local_a8,0xee9d2e);
        if (lVar4 == -1) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          local_1fc = atoi(pcVar2);
        }
        if ((int)local_1fc < 0) {
          pMVar5 = consumer(this);
          memset(&local_220,0,0x18);
          Error(pMVar5,(char *)0x0,&local_220,
                "--scalar-replacement must have no arguments or a non-negative integer argument");
          this_local._7_1_ = 0;
          local_f4 = 1;
          goto LAB_007d1a38;
        }
        CreateScalarReplacementPass((spvtools *)&local_208,local_1fc);
        RegisterPass(this,&local_208);
        PassToken::~PassToken(&local_208);
      }
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"strength-reduction");
    if (bVar1) {
      CreateStrengthReductionPass();
      RegisterPass(this,&local_228);
      PassToken::~PassToken(&local_228);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"unify-const");
    if (bVar1) {
      CreateUnifyConstantPass();
      RegisterPass(this,&local_230);
      PassToken::~PassToken(&local_230);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"flatten-decorations");
    if (bVar1) {
      CreateFlattenDecorationPass();
      RegisterPass(this,&local_238);
      PassToken::~PassToken(&local_238);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"compact-ids");
    if (bVar1) {
      CreateCompactIdsPass();
      RegisterPass(this,&local_240);
      PassToken::~PassToken(&local_240);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"cfg-cleanup");
    if (bVar1) {
      CreateCFGCleanupPass();
      RegisterPass(this,&local_248);
      PassToken::~PassToken(&local_248);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"local-redundancy-elimination");
    if (bVar1) {
      CreateLocalRedundancyEliminationPass();
      RegisterPass(this,&local_250);
      PassToken::~PassToken(&local_250);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-invariant-code-motion");
    if (bVar1) {
      CreateLoopInvariantCodeMotionPass();
      RegisterPass(this,&local_258);
      PassToken::~PassToken(&local_258);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"reduce-load-size");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        CreateReduceLoadSizePass((spvtools *)&load_replacement_threshold,0.9);
        RegisterPass(this,(PassToken *)&load_replacement_threshold);
        PassToken::~PassToken((PassToken *)&load_replacement_threshold);
      }
      else {
        local_268 = 0.9;
        lVar4 = std::__cxx11::string::find_first_not_of(local_a8,0xee9d2d);
        if (lVar4 == -1) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          local_268 = atof(pcVar2);
        }
        if (local_268 < 0.0) {
          pMVar5 = consumer(this);
          memset(&local_288,0,0x18);
          Error(pMVar5,(char *)0x0,&local_288,
                "--reduce-load-size must have no arguments or a non-negative double argument");
          this_local._7_1_ = 0;
          local_f4 = 1;
          goto LAB_007d1a38;
        }
        CreateReduceLoadSizePass((spvtools *)&local_270,local_268);
        RegisterPass(this,&local_270);
        PassToken::~PassToken(&local_270);
      }
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"redundancy-elimination");
    if (bVar1) {
      CreateRedundancyEliminationPass();
      RegisterPass(this,&local_290);
      PassToken::~PassToken(&local_290);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"private-to-local");
    if (bVar1) {
      CreatePrivateToLocalPass();
      RegisterPass(this,&local_298);
      PassToken::~PassToken(&local_298);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"remove-duplicates");
    if (bVar1) {
      CreateRemoveDuplicatesPass();
      RegisterPass(this,&local_2a0);
      PassToken::~PassToken(&local_2a0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"workaround-1209");
    if (bVar1) {
      CreateWorkaround1209Pass();
      RegisterPass(this,&local_2a8);
      PassToken::~PassToken(&local_2a8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"replace-invalid-opcode");
    if (bVar1) {
      CreateReplaceInvalidOpcodePass();
      RegisterPass(this,&local_2b0);
      PassToken::~PassToken(&local_2b0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"convert-relaxed-to-half");
    if (bVar1) {
      CreateConvertRelaxedToHalfPass();
      RegisterPass(this,&local_2b8);
      PassToken::~PassToken(&local_2b8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"relax-float-ops");
    if (bVar1) {
      CreateRelaxFloatOpsPass();
      RegisterPass(this,&local_2c0);
      PassToken::~PassToken(&local_2c0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"simplify-instructions");
    if (bVar1) {
      CreateSimplificationPass();
      RegisterPass(this,&local_2c8);
      PassToken::~PassToken(&local_2c8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"ssa-rewrite");
    if (bVar1) {
      CreateSSARewritePass();
      RegisterPass(this,&local_2d0);
      PassToken::~PassToken(&local_2d0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"copy-propagate-arrays");
    if (bVar1) {
      CreateCopyPropagateArraysPass();
      RegisterPass(this,(PassToken *)&stack0xfffffffffffffd28);
      PassToken::~PassToken((PassToken *)&stack0xfffffffffffffd28);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-fission");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        local_614 = -1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_614 = atoi(pcVar2);
      }
      local_2dc = local_614;
      if (local_614 < 1) {
        pMVar5 = consumer(this);
        memset(local_300,0,0x18);
        Error(pMVar5,(char *)0x0,(spv_position_t *)local_300,
              "--loop-fission must have a positive integer argument");
        this_local._7_1_ = 0;
        local_f4 = 1;
        goto LAB_007d1a38;
      }
      CreateLoopFissionPass((spvtools *)&local_2e8,(long)local_614);
      RegisterPass(this,&local_2e8);
      PassToken::~PassToken(&local_2e8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-fusion");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        local_624 = -1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_624 = atoi(pcVar2);
      }
      local_304 = local_624;
      if (local_624 < 1) {
        pMVar5 = consumer(this);
        memset(&local_328,0,0x18);
        Error(pMVar5,(char *)0x0,&local_328,"--loop-fusion must have a positive integer argument");
        this_local._7_1_ = 0;
        local_f4 = 1;
        goto LAB_007d1a38;
      }
      CreateLoopFusionPass((spvtools *)&local_310,(long)local_624);
      RegisterPass(this,&local_310);
      PassToken::~PassToken(&local_310);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-unroll");
    if (bVar1) {
      CreateLoopUnrollPass((spvtools *)&local_330,true,0);
      RegisterPass(this,&local_330);
      PassToken::~PassToken(&local_330);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"upgrade-memory-model");
    if (bVar1) {
      CreateUpgradeMemoryModelPass();
      RegisterPass(this,&local_338);
      PassToken::~PassToken(&local_338);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"vector-dce");
    if (bVar1) {
      CreateVectorDCEPass();
      RegisterPass(this,(PassToken *)&stack0xfffffffffffffcc0);
      PassToken::~PassToken((PassToken *)&stack0xfffffffffffffcc0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-unroll-partial");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        local_634 = 0;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_634 = atoi(pcVar2);
      }
      local_344 = local_634;
      if (local_634 < 1) {
        pMVar5 = consumer(this);
        memset(&local_368,0,0x18);
        Error(pMVar5,(char *)0x0,&local_368,
              "--loop-unroll-partial must have a positive integer argument");
        this_local._7_1_ = 0;
        local_f4 = 1;
        goto LAB_007d1a38;
      }
      CreateLoopUnrollPass((spvtools *)&local_350,false,local_634);
      RegisterPass(this,&local_350);
      PassToken::~PassToken(&local_350);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-peeling");
    if (bVar1) {
      CreateLoopPeelingPass();
      RegisterPass(this,(PassToken *)&stack0xfffffffffffffc90);
      PassToken::~PassToken((PassToken *)&stack0xfffffffffffffc90);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"loop-peeling-threshold");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        local_644 = 0;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_644 = atoi(pcVar2);
      }
      local_374 = local_644;
      if (local_644 < 1) {
        pMVar5 = consumer(this);
        memset(&local_390,0,0x18);
        Error(pMVar5,(char *)0x0,&local_390,
              "--loop-peeling-threshold must have a positive integer argument");
        this_local._7_1_ = 0;
        local_f4 = 1;
        goto LAB_007d1a38;
      }
      opt::LoopPeelingPass::SetLoopPeelingThreshold((long)local_644);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"ccp");
    if (bVar1) {
      CreateCCPPass();
      RegisterPass(this,&local_398);
      PassToken::~PassToken(&local_398);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"code-sink");
    if (bVar1) {
      CreateCodeSinkingPass();
      RegisterPass(this,&local_3a0);
      PassToken::~PassToken(&local_3a0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"fix-storage-class");
    if (bVar1) {
      CreateFixStorageClassPass();
      RegisterPass(this,&local_3a8);
      PassToken::~PassToken(&local_3a8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"O");
    if (bVar1) {
      RegisterPerformancePasses(this,(bool)(p.second.field_2._M_local_buf[0xf] & 1));
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"Os");
    if (bVar1) {
      RegisterSizePasses(this,(bool)(p.second.field_2._M_local_buf[0xf] & 1));
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"legalize-hlsl");
    if (bVar1) {
      RegisterLegalizationPasses(this,(bool)(p.second.field_2._M_local_buf[0xf] & 1));
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"remove-unused-interface-variables");
    if (bVar1) {
      CreateRemoveUnusedInterfaceVariablesPass();
      RegisterPass(this,&local_3b0);
      PassToken::~PassToken(&local_3b0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"graphics-robust-access");
    if (bVar1) {
      CreateGraphicsRobustAccessPass();
      RegisterPass(this,&local_3b8);
      PassToken::~PassToken(&local_3b8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"wrap-opkill");
    if (bVar1) {
      CreateWrapOpKillPass();
      RegisterPass(this,&local_3c0);
      PassToken::~PassToken(&local_3c0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"amd-ext-to-khr");
    if (bVar1) {
      CreateAmdExtToKhrPass();
      RegisterPass(this,&local_3c8);
      PassToken::~PassToken(&local_3c8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"interpolate-fixup");
    if (bVar1) {
      CreateInterpolateFixupPass();
      RegisterPass(this,&local_3d0);
      PassToken::~PassToken(&local_3d0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"remove-dont-inline");
    if (bVar1) {
      CreateRemoveDontInlinePass();
      RegisterPass(this,&local_3d8);
      PassToken::~PassToken(&local_3d8);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"eliminate-dead-input-components");
    if (bVar1) {
      CreateEliminateDeadInputComponentsSafePass();
      RegisterPass(this,&local_3e0);
      PassToken::~PassToken(&local_3e0);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"fix-func-call-param");
    if (bVar1) {
      CreateFixFuncCallArgumentsPass();
      RegisterPass(this,(PassToken *)&descriptor_set_binding_pairs);
      PassToken::~PassToken((PassToken *)&descriptor_set_binding_pairs);
      goto LAB_007d1a2a;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pass_args.field_2 + 8),"convert-to-sampled-image");
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 != 0) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
                  ((ConvertToSampledImagePass *)local_3f0,pcVar2);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_3f0);
        if (bVar1) {
          descriptor_set_binding_pairs_00 =
               std::
               unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
               ::operator*((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                            *)local_3f0);
          CreateConvertToSampledImagePass((spvtools *)&local_418,descriptor_set_binding_pairs_00);
          RegisterPass(this,&local_418);
          PassToken::~PassToken(&local_418);
        }
        else {
          pMVar5 = consumer(this);
          memset(&local_408,0,0x18);
          local_410 = (char *)std::__cxx11::string::c_str();
          Errorf<char_const*>(pMVar5,(char *)0x0,&local_408,
                              "Invalid argument for --convert-to-sampled-image: %s",&local_410);
          this_local._7_1_ = 0;
        }
        local_f4 = (uint)!bVar1;
        std::
        unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                       *)local_3f0);
        goto joined_r0x007d119d;
      }
      pMVar5 = consumer(this);
      memset(&local_430,0,0x18);
      local_438 = (char *)std::__cxx11::string::c_str();
      Errorf<char_const*>(pMVar5,(char *)0x0,&local_430,
                          "Invalid pairs of descriptor set and binding \'%s\'. Expected a string of <descriptor set>:<binding> pairs."
                          ,&local_438);
      this_local._7_1_ = 0;
      local_f4 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pass_args.field_2 + 8),"struct-packing");
      if (bVar1) {
        lVar4 = std::__cxx11::string::size();
        if (lVar4 == 0) {
          pMVar5 = consumer(this);
          memset(&separator_pos,0,0x18);
          Error(pMVar5,(char *)0x0,(spv_position_t *)&separator_pos,
                "--struct-packing requires a name:rule argument.");
          this_local._7_1_ = 0;
          local_f4 = 1;
        }
        else {
          local_458 = std::__cxx11::string::find((char)local_a8,0x3a);
          if (((local_458 != -1) && (local_458 != 0)) &&
             (lVar4 = local_458 + 1, lVar3 = std::__cxx11::string::size(), lVar4 != lVar3)) {
            std::__cxx11::string::substr((ulong)((long)&rule_name.field_2 + 8),(ulong)local_a8);
            std::__cxx11::string::substr((ulong)local_4b8,(ulong)local_a8);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            packingRule = (char *)std::__cxx11::string::c_str();
            CreateStructPackingPass((spvtools *)&local_4c0,pcVar2,packingRule);
            RegisterPass(this,&local_4c0);
            PassToken::~PassToken(&local_4c0);
            std::__cxx11::string::~string(local_4b8);
            std::__cxx11::string::~string((string *)(rule_name.field_2._M_local_buf + 8));
            goto LAB_007d1a2a;
          }
          pMVar5 = consumer(this);
          memset(&local_470,0,0x18);
          struct_name.field_2._8_8_ = std::__cxx11::string::c_str();
          Errorf<char_const*>(pMVar5,(char *)0x0,&local_470,
                              "Invalid argument for --struct-packing: %s",
                              (char **)((long)&struct_name.field_2 + 8));
          this_local._7_1_ = 0;
          local_f4 = 1;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&pass_args.field_2 + 8),"switch-descriptorset");
        if (bVar1) {
          lVar4 = std::__cxx11::string::size();
          if (lVar4 == 0) {
            pMVar5 = consumer(this);
            memset(&to_set,0,0x18);
            Error(pMVar5,(char *)0x0,(spv_position_t *)&to_set,
                  "--switch-descriptorset requires a from:to argument.");
            this_local._7_1_ = 0;
            local_f4 = 1;
          }
          else {
            start._4_4_ = 0;
            start._0_4_ = 0;
            pcVar2 = (char *)std::__cxx11::string::data();
            lVar4 = std::__cxx11::string::data();
            lVar3 = std::__cxx11::string::size();
            result._8_8_ = lVar4 + lVar3;
            _Var6 = std::from_chars<unsigned_int>
                              (pcVar2,(char *)result._8_8_,(uint *)((long)&start + 4),10);
            local_500 = _Var6.ptr;
            result.ptr = (char *)CONCAT44(result.ptr._4_4_,_Var6.ec);
            if (_Var6.ec == 0) {
              if (*local_500 == ':') {
                _Var6 = std::from_chars<unsigned_int>
                                  (local_500 + 1,(char *)result._8_8_,(uint *)&start,10);
                local_550 = _Var6.ptr;
                local_548 = _Var6.ec;
                result.ptr = (char *)CONCAT44(uStack_544,local_548);
                local_500 = local_550;
                if ((local_548 == 0) && (local_550 == (char *)result._8_8_)) {
                  CreateSwitchDescriptorSetPass((spvtools *)&local_578,start._4_4_,(uint32_t)start);
                  RegisterPass(this,&local_578);
                  PassToken::~PassToken(&local_578);
                  goto LAB_007d1a2a;
                }
                pMVar5 = consumer(this);
                memset(&local_568,0,0x18);
                local_570 = (char *)std::__cxx11::string::c_str();
                Errorf<char_const*>(pMVar5,(char *)0x0,&local_568,
                                    "Invalid argument for --switch-descriptorset: %s",&local_570);
                this_local._7_1_ = 0;
                local_f4 = 1;
              }
              else {
                pMVar5 = consumer(this);
                memset(&local_538,0,0x18);
                local_540 = (char *)std::__cxx11::string::c_str();
                Errorf<char_const*>(pMVar5,(char *)0x0,&local_538,
                                    "Invalid argument for --switch-descriptorset: %s",&local_540);
                this_local._7_1_ = 0;
                local_f4 = 1;
              }
            }
            else {
              pMVar5 = consumer(this);
              memset(&local_518,0,0x18);
              local_520 = (char *)std::__cxx11::string::c_str();
              Errorf<char_const*>(pMVar5,(char *)0x0,&local_518,
                                  "Invalid argument for --switch-descriptorset: %s",&local_520);
              this_local._7_1_ = 0;
              local_f4 = 1;
            }
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pass_args.field_2 + 8),"modify-maximal-reconvergence");
          if (bVar1) {
            lVar4 = std::__cxx11::string::size();
            if (lVar4 != 0) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a8,"add");
              if (bVar1) {
                CreateModifyMaximalReconvergencePass((spvtools *)&local_598,true);
                RegisterPass(this,&local_598);
                PassToken::~PassToken(&local_598);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a8,"remove");
                if (!bVar1) {
                  pMVar5 = consumer(this);
                  memset(&local_5b8,0,0x18);
                  local_5c0 = (char *)std::__cxx11::string::c_str();
                  Errorf<char_const*>(pMVar5,(char *)0x0,&local_5b8,
                                      "Invalid argument for --modify-maximal-reconvergence: %s (must be \'add\' or \'remove\')"
                                      ,&local_5c0);
                  this_local._7_1_ = 0;
                  local_f4 = 1;
                  goto LAB_007d1a38;
                }
                CreateModifyMaximalReconvergencePass((spvtools *)&local_5a0,false);
                RegisterPass(this,&local_5a0);
                PassToken::~PassToken(&local_5a0);
              }
              goto LAB_007d1a2a;
            }
            pMVar5 = consumer(this);
            memset(&local_590,0,0x18);
            Error(pMVar5,(char *)0x0,&local_590,
                  "--modify-maximal-reconvergence requires an argument");
            this_local._7_1_ = 0;
            local_f4 = 1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&pass_args.field_2 + 8),"trim-capabilities");
            if (bVar1) {
              CreateTrimCapabilitiesPass();
              RegisterPass(this,&local_5c8);
              PassToken::~PassToken(&local_5c8);
              goto LAB_007d1a2a;
            }
            pMVar5 = consumer(this);
            memset(&local_5e0,0,0x18);
            local_5e8 = (char *)std::__cxx11::string::c_str();
            Errorf<char_const*>(pMVar5,(char *)0x0,&local_5e0,
                                "Unknown flag \'--%s\'. Use --help for a list of valid flags",
                                &local_5e8);
            this_local._7_1_ = 0;
            local_f4 = 1;
          }
        }
      }
    }
  }
LAB_007d1a38:
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(pass_args.field_2._M_local_buf + 8));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&pass_name.field_2 + 8));
LAB_007d1a56:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Optimizer::RegisterPassFromFlag(const std::string& flag,
                                     bool preserve_interface) {
  if (!FlagHasValidForm(flag)) {
    return false;
  }

  // Split flags of the form --pass_name=pass_args.
  auto p = utils::SplitFlagArgs(flag);
  std::string pass_name = p.first;
  std::string pass_args = p.second;

  // FIXME(dnovillo): This should be re-factored so that pass names can be
  // automatically checked against Pass::name() and PassToken instances created
  // via a template function.  Additionally, class Pass should have a desc()
  // method that describes the pass (so it can be used in --help).
  //
  // Both Pass::name() and Pass::desc() should be static class members so they
  // can be invoked without creating a pass instance.
  if (pass_name == "strip-debug") {
    RegisterPass(CreateStripDebugInfoPass());
  } else if (pass_name == "strip-reflect") {
    RegisterPass(CreateStripReflectInfoPass());
  } else if (pass_name == "strip-nonsemantic") {
    RegisterPass(CreateStripNonSemanticInfoPass());
  } else if (pass_name == "fix-opextinst-opcodes") {
    RegisterPass(CreateOpExtInstWithForwardReferenceFixupPass());
  } else if (pass_name == "set-spec-const-default-value") {
    if (pass_args.size() > 0) {
      auto spec_ids_vals =
          opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString(
              pass_args.c_str());
      if (!spec_ids_vals) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --set-spec-const-default-value: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(
          CreateSetSpecConstantDefaultValuePass(std::move(*spec_ids_vals)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid spec constant value string '%s'. Expected a string of "
             "<spec id>:<default value> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "if-conversion") {
    RegisterPass(CreateIfConversionPass());
  } else if (pass_name == "freeze-spec-const") {
    RegisterPass(CreateFreezeSpecConstantValuePass());
  } else if (pass_name == "inline-entry-points-exhaustive") {
    RegisterPass(CreateInlineExhaustivePass());
  } else if (pass_name == "inline-entry-points-opaque") {
    RegisterPass(CreateInlineOpaquePass());
  } else if (pass_name == "combine-access-chains") {
    RegisterPass(CreateCombineAccessChainsPass());
  } else if (pass_name == "convert-local-access-chains") {
    RegisterPass(CreateLocalAccessChainConvertPass());
  } else if (pass_name == "replace-desc-array-access-using-var-index") {
    RegisterPass(CreateReplaceDescArrayAccessUsingVarIndexPass());
  } else if (pass_name == "spread-volatile-semantics") {
    RegisterPass(CreateSpreadVolatileSemanticsPass());
  } else if (pass_name == "descriptor-scalar-replacement") {
    RegisterPass(CreateDescriptorScalarReplacementPass());
  } else if (pass_name == "descriptor-composite-scalar-replacement") {
    RegisterPass(CreateDescriptorCompositeScalarReplacementPass());
  } else if (pass_name == "descriptor-array-scalar-replacement") {
    RegisterPass(CreateDescriptorArrayScalarReplacementPass());
  } else if (pass_name == "eliminate-dead-code-aggressive") {
    RegisterPass(CreateAggressiveDCEPass(preserve_interface));
  } else if (pass_name == "eliminate-insert-extract") {
    RegisterPass(CreateInsertExtractElimPass());
  } else if (pass_name == "eliminate-local-single-block") {
    RegisterPass(CreateLocalSingleBlockLoadStoreElimPass());
  } else if (pass_name == "eliminate-local-single-store") {
    RegisterPass(CreateLocalSingleStoreElimPass());
  } else if (pass_name == "merge-blocks") {
    RegisterPass(CreateBlockMergePass());
  } else if (pass_name == "merge-return") {
    RegisterPass(CreateMergeReturnPass());
  } else if (pass_name == "eliminate-dead-branches") {
    RegisterPass(CreateDeadBranchElimPass());
  } else if (pass_name == "eliminate-dead-functions") {
    RegisterPass(CreateEliminateDeadFunctionsPass());
  } else if (pass_name == "eliminate-local-multi-store") {
    RegisterPass(CreateLocalMultiStoreElimPass());
  } else if (pass_name == "eliminate-dead-const") {
    RegisterPass(CreateEliminateDeadConstantPass());
  } else if (pass_name == "eliminate-dead-inserts") {
    RegisterPass(CreateDeadInsertElimPass());
  } else if (pass_name == "eliminate-dead-variables") {
    RegisterPass(CreateDeadVariableEliminationPass());
  } else if (pass_name == "eliminate-dead-members") {
    RegisterPass(CreateEliminateDeadMembersPass());
  } else if (pass_name == "fold-spec-const-op-composite") {
    RegisterPass(CreateFoldSpecConstantOpAndCompositePass());
  } else if (pass_name == "loop-unswitch") {
    RegisterPass(CreateLoopUnswitchPass());
  } else if (pass_name == "scalar-replacement") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateScalarReplacementPass());
    } else {
      int limit = -1;
      if (pass_args.find_first_not_of("0123456789") == std::string::npos) {
        limit = atoi(pass_args.c_str());
      }

      if (limit >= 0) {
        RegisterPass(CreateScalarReplacementPass(limit));
      } else {
        Error(consumer(), nullptr, {},
              "--scalar-replacement must have no arguments or a non-negative "
              "integer argument");
        return false;
      }
    }
  } else if (pass_name == "strength-reduction") {
    RegisterPass(CreateStrengthReductionPass());
  } else if (pass_name == "unify-const") {
    RegisterPass(CreateUnifyConstantPass());
  } else if (pass_name == "flatten-decorations") {
    RegisterPass(CreateFlattenDecorationPass());
  } else if (pass_name == "compact-ids") {
    RegisterPass(CreateCompactIdsPass());
  } else if (pass_name == "cfg-cleanup") {
    RegisterPass(CreateCFGCleanupPass());
  } else if (pass_name == "local-redundancy-elimination") {
    RegisterPass(CreateLocalRedundancyEliminationPass());
  } else if (pass_name == "loop-invariant-code-motion") {
    RegisterPass(CreateLoopInvariantCodeMotionPass());
  } else if (pass_name == "reduce-load-size") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateReduceLoadSizePass());
    } else {
      double load_replacement_threshold = 0.9;
      if (pass_args.find_first_not_of(".0123456789") == std::string::npos) {
        load_replacement_threshold = atof(pass_args.c_str());
      }

      if (load_replacement_threshold >= 0) {
        RegisterPass(CreateReduceLoadSizePass(load_replacement_threshold));
      } else {
        Error(consumer(), nullptr, {},
              "--reduce-load-size must have no arguments or a non-negative "
              "double argument");
        return false;
      }
    }
  } else if (pass_name == "redundancy-elimination") {
    RegisterPass(CreateRedundancyEliminationPass());
  } else if (pass_name == "private-to-local") {
    RegisterPass(CreatePrivateToLocalPass());
  } else if (pass_name == "remove-duplicates") {
    RegisterPass(CreateRemoveDuplicatesPass());
  } else if (pass_name == "workaround-1209") {
    RegisterPass(CreateWorkaround1209Pass());
  } else if (pass_name == "replace-invalid-opcode") {
    RegisterPass(CreateReplaceInvalidOpcodePass());
  } else if (pass_name == "convert-relaxed-to-half") {
    RegisterPass(CreateConvertRelaxedToHalfPass());
  } else if (pass_name == "relax-float-ops") {
    RegisterPass(CreateRelaxFloatOpsPass());
  } else if (pass_name == "simplify-instructions") {
    RegisterPass(CreateSimplificationPass());
  } else if (pass_name == "ssa-rewrite") {
    RegisterPass(CreateSSARewritePass());
  } else if (pass_name == "copy-propagate-arrays") {
    RegisterPass(CreateCopyPropagateArraysPass());
  } else if (pass_name == "loop-fission") {
    int register_threshold_to_split =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (register_threshold_to_split > 0) {
      RegisterPass(CreateLoopFissionPass(
          static_cast<size_t>(register_threshold_to_split)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fission must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-fusion") {
    int max_registers_per_loop =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (max_registers_per_loop > 0) {
      RegisterPass(
          CreateLoopFusionPass(static_cast<size_t>(max_registers_per_loop)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fusion must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-unroll") {
    RegisterPass(CreateLoopUnrollPass(true));
  } else if (pass_name == "upgrade-memory-model") {
    RegisterPass(CreateUpgradeMemoryModelPass());
  } else if (pass_name == "vector-dce") {
    RegisterPass(CreateVectorDCEPass());
  } else if (pass_name == "loop-unroll-partial") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      RegisterPass(CreateLoopUnrollPass(false, factor));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-unroll-partial must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-peeling") {
    RegisterPass(CreateLoopPeelingPass());
  } else if (pass_name == "loop-peeling-threshold") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      opt::LoopPeelingPass::SetLoopPeelingThreshold(factor);
    } else {
      Error(consumer(), nullptr, {},
            "--loop-peeling-threshold must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "ccp") {
    RegisterPass(CreateCCPPass());
  } else if (pass_name == "code-sink") {
    RegisterPass(CreateCodeSinkingPass());
  } else if (pass_name == "fix-storage-class") {
    RegisterPass(CreateFixStorageClassPass());
  } else if (pass_name == "O") {
    RegisterPerformancePasses(preserve_interface);
  } else if (pass_name == "Os") {
    RegisterSizePasses(preserve_interface);
  } else if (pass_name == "legalize-hlsl") {
    RegisterLegalizationPasses(preserve_interface);
  } else if (pass_name == "remove-unused-interface-variables") {
    RegisterPass(CreateRemoveUnusedInterfaceVariablesPass());
  } else if (pass_name == "graphics-robust-access") {
    RegisterPass(CreateGraphicsRobustAccessPass());
  } else if (pass_name == "wrap-opkill") {
    RegisterPass(CreateWrapOpKillPass());
  } else if (pass_name == "amd-ext-to-khr") {
    RegisterPass(CreateAmdExtToKhrPass());
  } else if (pass_name == "interpolate-fixup") {
    RegisterPass(CreateInterpolateFixupPass());
  } else if (pass_name == "remove-dont-inline") {
    RegisterPass(CreateRemoveDontInlinePass());
  } else if (pass_name == "eliminate-dead-input-components") {
    RegisterPass(CreateEliminateDeadInputComponentsSafePass());
  } else if (pass_name == "fix-func-call-param") {
    RegisterPass(CreateFixFuncCallArgumentsPass());
  } else if (pass_name == "convert-to-sampled-image") {
    if (pass_args.size() > 0) {
      auto descriptor_set_binding_pairs =
          opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
              pass_args.c_str());
      if (!descriptor_set_binding_pairs) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --convert-to-sampled-image: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(CreateConvertToSampledImagePass(
          std::move(*descriptor_set_binding_pairs)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid pairs of descriptor set and binding '%s'. Expected a "
             "string of <descriptor set>:<binding> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "struct-packing") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--struct-packing requires a name:rule argument.");
      return false;
    }

    auto separator_pos = pass_args.find(':');
    if (separator_pos == std::string::npos || separator_pos == 0 ||
        separator_pos + 1 == pass_args.size()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --struct-packing: %s", pass_args.c_str());
      return false;
    }

    const std::string struct_name = pass_args.substr(0, separator_pos);
    const std::string rule_name = pass_args.substr(separator_pos + 1);

    RegisterPass(
        CreateStructPackingPass(struct_name.c_str(), rule_name.c_str()));
  } else if (pass_name == "switch-descriptorset") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--switch-descriptorset requires a from:to argument.");
      return false;
    }
    uint32_t from_set = 0, to_set = 0;
    const char* start = pass_args.data();
    const char* end = pass_args.data() + pass_args.size();

    auto result = std::from_chars(start, end, from_set);
    if (result.ec != std::errc()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start = result.ptr;
    if (start[0] != ':') {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start++;
    result = std::from_chars(start, end, to_set);
    if (result.ec != std::errc() || result.ptr != end) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    RegisterPass(CreateSwitchDescriptorSetPass(from_set, to_set));
  } else if (pass_name == "modify-maximal-reconvergence") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--modify-maximal-reconvergence requires an argument");
      return false;
    }
    if (pass_args == "add") {
      RegisterPass(CreateModifyMaximalReconvergencePass(true));
    } else if (pass_args == "remove") {
      RegisterPass(CreateModifyMaximalReconvergencePass(false));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --modify-maximal-reconvergence: %s (must be "
             "'add' or 'remove')",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "trim-capabilities") {
    RegisterPass(CreateTrimCapabilitiesPass());
  } else {
    Errorf(consumer(), nullptr, {},
           "Unknown flag '--%s'. Use --help for a list of valid flags",
           pass_name.c_str());
    return false;
  }

  return true;
}